

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Connection_testSpike_Test::TestBody(Connection_testSpike_Test *this)

{
  char *pcVar1;
  AssertHelper local_c8;
  AssertionResult gtest_ar_1;
  Connection local_b0;
  Connection s;
  float local_7c;
  Neuron n;
  
  Neuron::Neuron(&n,10.0,1.0,50.0);
  local_b0.m_target._0_4_ = 0;
  gtest_ar_1._0_4_ = Neuron::syn(&n);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&s,"0","n.syn()",(int *)&local_b0,(float *)&gtest_ar_1);
  if ((char)s.m_target == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if (s._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)s._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&s.m_weight);
  Connection::Connection(&s,&n,10.0,100.0,100.0);
  Connection::spike(&s);
  Connection::Connection(&local_b0,(Neuron *)0x0,10.0,100.0,100.0);
  local_c8.data_._0_4_ = Connection::weight(&local_b0);
  local_7c = Neuron::syn(&n);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar_1,"Connection(0, 10).weight()","n.syn()",(float *)&local_c8,
             &local_7c);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Neuron::~Neuron(&n);
  return;
}

Assistant:

TEST(Connection, testSpike)
{
    Neuron n;
    EXPECT_EQ(0, n.syn());
    Connection s(&n, 10);
    s.spike();
    EXPECT_EQ(Connection(0, 10).weight(), n.syn());
}